

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_regex_traits.hpp
# Opt level: O2

char_type __thiscall
boost::xpressive::cpp_regex_traits<char>::widen(cpp_regex_traits<char> *this,char ch)

{
  char_type cVar1;
  
  cVar1 = std::ctype<char>::widen(this->ctype_,ch);
  return cVar1;
}

Assistant:

char_type widen(char ch) const
    {
        return this->ctype_->widen(ch);
    }